

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<QList<QKeyCombination>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  Stream *__old_val;
  long in_FS_OFFSET;
  QDebug local_38;
  QtPrivate local_30 [8];
  Stream *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = dbg->stream;
  *(int *)(local_28 + 0x28) = *(int *)(local_28 + 0x28) + 1;
  local_38.stream = (Stream *)0x0;
  printSequentialContainer<QList<QKeyCombination>>
            (local_30,(Stream *)&local_28,"QList",(QList<QKeyCombination> *)a);
  QDebug::~QDebug((QDebug *)&local_28);
  QDebug::~QDebug((QDebug *)local_30);
  QDebug::~QDebug(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }